

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

type __thiscall
chaiscript::Boxed_Number::go<int,float>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  element_type *peVar1;
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  Boxed_Value BVar3;
  type tVar4;
  float local_10;
  float local_c;
  
  if (t_oper - equals < 6) {
    local_10 = (float)*((t_lhs->m_data).
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_const_data_ptr;
    local_c = *((t_rhs->m_data).
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->m_const_data_ptr;
    BVar3 = boolean_go<float>(this,t_oper,&local_10,&local_c);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else if (t_oper - assign < 7) {
    peVar1 = (t_lhs->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((((peVar1->m_type_info).m_flags & 1) != 0) || (peVar1->m_return_value != false)) {
LAB_00166866:
      this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
      detail::exception::bad_any_cast::bad_any_cast(this_00);
      __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                  detail::exception::bad_any_cast::~bad_any_cast);
    }
    local_10 = *((t_rhs->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_const_data_ptr;
    BVar3 = binary_go<int,float>(this,t_oper,(int *)peVar1->m_data_ptr,&local_10,t_lhs);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    if ((int)t_oper < 0x1f) goto LAB_00166866;
    local_10 = (float)*((t_lhs->m_data).
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_const_data_ptr;
    local_c = *((t_rhs->m_data).
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->m_const_data_ptr;
    BVar3 = const_binary_go<float>
                      ((Opers)this,(float *)CONCAT44(in_register_00000034,t_oper),&local_10);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  tVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  tVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (type)tVar4.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs) 
          -> typename std::enable_if<std::is_floating_point<LHS>::value || std::is_floating_point<RHS>::value, Boxed_Value>::type
      {
        typedef typename std::common_type<LHS, RHS>::type common_type;
        if (t_oper > Operators::boolean_flag && t_oper < Operators::non_const_flag)
        {
          return boolean_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else if (t_oper > Operators::non_const_flag && t_oper < Operators::non_const_int_flag && !t_lhs.is_const() && !t_lhs.is_return_value()) {
          return binary_go(t_oper, *static_cast<LHS *>(t_lhs.get_ptr()), get_as_aux<common_type, RHS>(t_rhs), t_lhs);
        } else if (t_oper > Operators::const_flag) {
          return const_binary_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }
      }